

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

reentrant_put_transaction<void> *
density_tests::detail::
PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *i_rand)

{
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::Data>
  local_68;
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::Data>
  local_48;
  
  density::
  conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>::
  start_reentrant_emplace<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>::Data>
            (&local_48,
             (conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>
              *)i_queue);
  local_68.m_queue = local_48.m_queue;
  local_68.m_put_transaction.m_queue = local_48.m_put_transaction.m_queue;
  local_68.m_put_transaction.m_put_data.m_control_block =
       local_48.m_put_transaction.m_put_data.m_control_block;
  local_68.m_put_transaction.m_put_data.m_user_storage =
       local_48.m_put_transaction.m_put_data.m_user_storage;
  local_48.m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)0x0;
  local_48.m_put_transaction.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  density::
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::Data>
  ::~reentrant_put_transaction(&local_48);
  PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
  ::
  put_impl<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>::reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>::Data>>
            (&local_68,i_rand);
  __return_storage_ptr__->m_queue = local_68.m_queue;
  (__return_storage_ptr__->m_put_transaction).m_queue = local_68.m_put_transaction.m_queue;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_control_block =
       local_68.m_put_transaction.m_put_data.m_control_block;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_user_storage =
       local_68.m_put_transaction.m_put_data.m_user_storage;
  local_68.m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)0x0;
  local_68.m_put_transaction.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  density::
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::Data>
  ::~reentrant_put_transaction(&local_68);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<>
              reentrant_put(QUEUE & i_queue, EasyRandom & i_rand)
            {
                auto put = i_queue.template start_reentrant_emplace<ElementType>();
                put_impl(put, i_rand);
                return std::move(put);
            }